

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::PathTypeHandlerBase::DeleteLastProperty(PathTypeHandlerBase *this,DynamicObject *object)

{
  DynamicType *this_00;
  DynamicTypeHandler *this_01;
  TypePath *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 *puVar8;
  
  this_00 = (this->predecessorType).ptr;
  if (this_00 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x38a,"(predecessorType != nullptr)","predecessorType != nullptr");
    if (!bVar4) goto LAB_00dd016c;
    *puVar8 = 0;
  }
  bVar4 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandlerUnchecked
                    (&this->super_DynamicTypeHandler);
  iVar7 = (*((this_00->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4e])();
  if (iVar7 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x39a,"(predecessorType->GetTypeHandler()->IsPathTypeHandler())",
                                "predecessorType->GetTypeHandler()->IsPathTypeHandler()");
    if (!bVar5) goto LAB_00dd016c;
    *puVar8 = 0;
  }
  this_01 = (this_00->typeHandler).ptr;
  if (((this->super_DynamicTypeHandler).unusedBytes >> 1) - 1 != (uint)(this_01->unusedBytes >> 1))
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x39d,
                                "(predecessorTypeHandler->GetUnusedBytesValue() == (this->GetUnusedBytesValue() - 1))"
                                ,
                                "predecessorTypeHandler->GetUnusedBytesValue() == (this->GetUnusedBytesValue() - 1)"
                               );
    if (!bVar5) goto LAB_00dd016c;
    *puVar8 = 0;
  }
  bVar5 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandlerUnchecked(this_01);
  if (bVar4 && !bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x3a1,"(!isCurrentTypeOHI || isPredecessorTypeOHI)",
                                "Current type is ObjectHeaderInlined but previous type is not ObjectHeaderInlined?"
                               );
    if (!bVar6) goto LAB_00dd016c;
    *puVar8 = 0;
  }
  if ((bVar4 == bVar5) &&
     ((this->super_DynamicTypeHandler).inlineSlotCapacity != this_01->inlineSlotCapacity)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x3a5,
                                "((isCurrentTypeOHI ^ isPredecessorTypeOHI) || (this->GetInlineSlotCapacity() == predecessorTypeHandler->GetInlineSlotCapacity()))"
                                ,
                                "When both types are ObjectHeaderInlined (or not ObjectHeaderInlined), InlineSlotCapacity of types should match"
                               );
    if (!bVar6) goto LAB_00dd016c;
    *puVar8 = 0;
  }
  if (!bVar4 && bVar5) {
    bVar4 = DynamicObject::HasObjectArray(object);
    if (bVar4) {
      return 0;
    }
    if (((this->super_DynamicTypeHandler).unusedBytes >> 1) - 1 != (uint)this_01->inlineSlotCapacity
       ) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x3af,
                                  "(predecessorTypeHandler->GetInlineSlotCapacity() == (this->GetUnusedBytesValue() - 1))"
                                  ,
                                  "predecessorTypeHandler->GetInlineSlotCapacity() == (this->GetUnusedBytesValue() - 1)"
                                 );
      if (!bVar4) goto LAB_00dd016c;
      *puVar8 = 0;
    }
    MoveAuxSlotsToObjectHeader(this,object);
  }
  if ((this->super_DynamicTypeHandler).slotCapacity < this_01->slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x3b3,
                                "(predecessorTypeHandler->GetSlotCapacity() <= this->GetSlotCapacity())"
                                ,
                                "predecessorTypeHandler->GetSlotCapacity() <= this->GetSlotCapacity()"
                               );
    if (!bVar4) {
LAB_00dd016c:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  DynamicType::ShareType(this_00);
  pTVar1 = (this->typePath).ptr;
  pRVar2 = (pTVar1->singletonInstance).ptr;
  if ((pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef == object)) {
    (pTVar1->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  }
  (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[99])(object,this_00);
  return 1;
}

Assistant:

BOOL PathTypeHandlerBase::DeleteLastProperty(DynamicObject *const object)
    {
        DynamicType* predecessorType = this->GetPredecessorType();
        Assert(predecessorType != nullptr);

        // -----------------------------------------------------------------------------------------
        //         Current Type     |      Predecessor Type      |       Action
        // -----------------------------------------------------------------------------------------
        //    ObjectHeaderInlined   |    ObjectHeaderInlined     | No movement needed
        // -----------------------------------------------------------------------------------------
        //    ObjectHeaderInlined   |  Not ObjectHeaderInlined   | Not possible (Should be a BUG)
        // -----------------------------------------------------------------------------------------
        //  Not ObjectHeaderInlined |  Not ObjectHeaderInlined   | No movement needed
        // -----------------------------------------------------------------------------------------
        //  Not ObjectHeaderInlined |    ObjectHeaderInlined     | Move from auxSlots to inline slots (ReOptimize)
        // -----------------------------------------------------------------------------------------

        bool isCurrentTypeOHI = this->IsObjectHeaderInlinedTypeHandlerUnchecked();

        Assert(predecessorType->GetTypeHandler()->IsPathTypeHandler());
        PathTypeHandlerBase* predecessorTypeHandler = (PathTypeHandlerBase*)predecessorType->GetTypeHandler();

        Assert(predecessorTypeHandler->GetUnusedBytesValue() == (this->GetUnusedBytesValue() - 1));

        bool isPredecessorTypeOHI = predecessorTypeHandler->IsObjectHeaderInlinedTypeHandlerUnchecked();

        AssertMsg(!isCurrentTypeOHI || isPredecessorTypeOHI, "Current type is ObjectHeaderInlined but previous type is not ObjectHeaderInlined?");

        AssertMsg((isCurrentTypeOHI ^ isPredecessorTypeOHI) ||
            (this->GetInlineSlotCapacity() == predecessorTypeHandler->GetInlineSlotCapacity()),
            "When both types are ObjectHeaderInlined (or not ObjectHeaderInlined), InlineSlotCapacity of types should match");

        if (!isCurrentTypeOHI && isPredecessorTypeOHI)
        {
            if (object->HasObjectArray())
            {
                // We can't move auxSlots
                return FALSE;
            }

            Assert(predecessorTypeHandler->GetInlineSlotCapacity() == (this->GetUnusedBytesValue() - 1));
            this->MoveAuxSlotsToObjectHeader(object);
        }

        Assert(predecessorTypeHandler->GetSlotCapacity() <= this->GetSlotCapacity());

        // Another type (this) reached the old (predecessorType) type so share it.
        // ShareType will take care of invalidating fixed fields and removing singleton object from predecessorType
        predecessorType->ShareType();

#if ENABLE_FIXED_FIELDS
        this->GetTypePath()->ClearSingletonInstanceIfSame(object);
#endif

        object->ReplaceTypeWithPredecessorType(predecessorType);

        return TRUE;
    }